

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<operator_token> read_operator(string_view buf_1,string_view buf_2)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  bool bVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar3;
  optional<operator_token> oVar4;
  operator_token local_168;
  operator_token local_160;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_158;
  size_t local_148;
  char *local_140;
  operator_token local_138;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  size_t local_120;
  char *local_118;
  operator_token local_110;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  size_t local_f8;
  char *local_f0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  char *local_d8;
  char *local_d0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c8;
  size_t local_b8;
  char *local_b0;
  operator_token local_a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a0;
  char *local_90;
  char *local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  size_t local_70;
  char *local_68;
  operator_token local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  char *local_48;
  char *local_40;
  size_t local_38;
  string_view buf_2_local;
  string_view buf_1_local;
  undefined1 local_c;
  
  buf_2_local._M_len = (size_t)buf_2._M_str;
  local_38 = buf_2._M_len;
  local_40 = buf_1._M_str;
  local_48 = (char *)buf_1._M_len;
  buf_2_local._M_str = local_48;
  buf_1_local._M_len = (size_t)local_40;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"<");
  __x_06._M_str = local_40;
  __x_06._M_len = (size_t)local_48;
  bVar1 = std::operator==(__x_06,local_58);
  if (bVar1) {
    local_70 = local_38;
    local_68 = (char *)buf_2_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"=");
    __x_05._M_str = local_68;
    __x_05._M_len = local_70;
    bVar1 = std::operator==(__x_05,local_80);
    iVar2 = 1;
    if (bVar1) {
      iVar2 = 2;
    }
    operator_token::operator_token(&local_60,less,iVar2);
    std::optional<operator_token>::optional<operator_token,_true>
              ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_60);
    uVar3 = extraout_RDX;
  }
  else {
    local_90 = buf_2_local._M_str;
    local_88 = (char *)buf_1_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,">");
    __x_04._M_str = local_88;
    __x_04._M_len = (size_t)local_90;
    bVar1 = std::operator==(__x_04,local_a0);
    if (bVar1) {
      local_b8 = local_38;
      local_b0 = (char *)buf_2_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"=");
      __x_03._M_str = local_b0;
      __x_03._M_len = local_b8;
      bVar1 = std::operator==(__x_03,local_c8);
      iVar2 = 1;
      if (bVar1) {
        iVar2 = 2;
      }
      operator_token::operator_token(&local_a8,greater,iVar2);
      std::optional<operator_token>::optional<operator_token,_true>
                ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_a8);
      uVar3 = extraout_RDX_00;
    }
    else {
      local_d8 = buf_2_local._M_str;
      local_d0 = (char *)buf_1_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"=");
      __x_02._M_str = local_d0;
      __x_02._M_len = (size_t)local_d8;
      bVar1 = std::operator==(__x_02,local_e8);
      if (bVar1) {
        local_f8 = local_38;
        local_f0 = (char *)buf_2_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"<");
        __x_01._M_str = local_f0;
        __x_01._M_len = local_f8;
        bVar1 = std::operator==(__x_01,local_108);
        if (bVar1) {
          operator_token::operator_token(&local_110,less,2);
          std::optional<operator_token>::optional<operator_token,_true>
                    ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_110);
          uVar3 = extraout_RDX_01;
        }
        else {
          local_120 = local_38;
          local_118 = (char *)buf_2_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"=");
          __x_00._M_str = local_118;
          __x_00._M_len = local_120;
          bVar1 = std::operator==(__x_00,local_130);
          if (bVar1) {
            operator_token::operator_token(&local_138,equal,2);
            std::optional<operator_token>::optional<operator_token,_true>
                      ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_138);
            uVar3 = extraout_RDX_02;
          }
          else {
            local_148 = local_38;
            local_140 = (char *)buf_2_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_158,">")
            ;
            __x._M_str = local_140;
            __x._M_len = local_148;
            bVar1 = std::operator==(__x,local_158);
            if (bVar1) {
              operator_token::operator_token(&local_160,greater,2);
              std::optional<operator_token>::optional<operator_token,_true>
                        ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_160);
              uVar3 = extraout_RDX_03;
            }
            else {
              operator_token::operator_token(&local_168,equal,1);
              std::optional<operator_token>::optional<operator_token,_true>
                        ((optional<operator_token> *)((long)&buf_1_local._M_str + 4),&local_168);
              uVar3 = extraout_RDX_04;
            }
          }
        }
      }
      else {
        std::optional<operator_token>::optional
                  ((optional<operator_token> *)((long)&buf_1_local._M_str + 4));
        uVar3 = extraout_RDX_05;
      }
    }
  }
  oVar4.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._8_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),local_c);
  oVar4.super__Optional_base<operator_token,_true,_true>._M_payload.
  super__Optional_payload_base<operator_token>._M_payload = stack0xffffffffffffffec;
  return (optional<operator_token>)
         oVar4.super__Optional_base<operator_token,_true,_true>._M_payload.
         super__Optional_payload_base<operator_token>;
}

Assistant:

std::optional<operator_token>
read_operator(const std::string_view buf_1,
              const std::string_view buf_2) noexcept
{
    if (buf_1 == "<")
        return operator_token{ baryonyx::operator_type::less,
                               buf_2 == "=" ? 2 : 1 };

    if (buf_1 == ">")
        return operator_token{ baryonyx::operator_type::greater,
                               buf_2 == "=" ? 2 : 1 };

    if (buf_1 == "=") {
        if (buf_2 == "<")
            return operator_token{ baryonyx::operator_type::less, 2 };

        if (buf_2 == "=")
            return operator_token{ baryonyx::operator_type::equal, 2 };

        if (buf_2 == ">")
            return operator_token{ baryonyx::operator_type::greater, 2 };

        return operator_token{ baryonyx::operator_type::equal, 1 };
    }

    return std::nullopt;
}